

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomType.cpp
# Opt level: O2

void __thiscall OpenMD::AtomType::setMass(AtomType *this,RealType m)

{
  mapped_type_conflict1 *pmVar1;
  allocator<char> local_39;
  RealType local_38;
  key_type local_30;
  
  local_38 = m;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"mass",&local_39);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           ::operator[](&this->myResponsibilities_,&local_30);
  *pmVar1 = true;
  std::__cxx11::string::~string((string *)&local_30);
  this->mass_ = local_38;
  return;
}

Assistant:

void AtomType::setMass(RealType m) {
    myResponsibilities_["mass"] = true;
    mass_                       = m;
  }